

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::RegistryTest_merge_same_families_Test::TestBody
          (RegistryTest_merge_same_families_Test *this)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  Builder<prometheus::Counter> *pBVar2;
  Family<prometheus::Counter> *this_01;
  char *message;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2a8;
  AssertHelper local_270;
  Message local_268;
  size_type local_260;
  uint local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> collected;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  iterator local_1d8;
  size_type local_1d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  allocator local_191;
  string local_190;
  allocator local_169;
  string local_168;
  Builder<prometheus::Counter> local_138;
  long local_c8;
  size_t loops;
  Registry registry;
  RegistryTest_merge_same_families_Test *this_local;
  
  registry.mutex_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this
  ;
  Registry::Registry((Registry *)&loops,Merge);
  local_c8 = 4;
  while (local_c8 != 0) {
    local_c8 = local_c8 + -1;
    BuildCounter();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,"counter",&local_169);
    pBVar2 = detail::Builder<prometheus::Counter>::Name(&local_138,&local_168);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"Test Counter",&local_191);
    pBVar2 = detail::Builder<prometheus::Counter>::Help(pBVar2,&local_190);
    this_01 = detail::Builder<prometheus::Counter>::Register(pBVar2,(Registry *)&loops);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[5],_const_char_(&)[13],_true>
              (&local_218,(char (*) [5])0x201543,(char (*) [13])"test_counter");
    local_1d8 = &local_218;
    local_1d0 = 1;
    this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&collected.
                         super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(this_00);
    __l._M_len = local_1d0;
    __l._M_array = local_1d8;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&local_1c8,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          ((long)&collected.
                  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),this_00);
    Family<prometheus::Counter>::Add<>(this_01,&local_1c8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(&local_1c8);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&collected.
                            super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    local_2a8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_1d8;
    do {
      local_2a8 = local_2a8 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_2a8);
    } while (local_2a8 != &local_218);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    detail::Builder<prometheus::Counter>::~Builder(&local_138);
  }
  local_c8 = local_c8 + -1;
  Registry::Collect((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                    &gtest_ar.message_,(Registry *)&loops);
  local_254 = 1;
  local_260 = std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::size
                        ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                          *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_250,"1U","collected.size()",&local_254,&local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
               ,0x88,message);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             &gtest_ar.message_);
  Registry::~Registry((Registry *)&loops);
  return;
}

Assistant:

TEST(RegistryTest, merge_same_families) {
  Registry registry{Registry::InsertBehavior::Merge};

  std::size_t loops = 4;

  while (loops-- > 0) {
    BuildCounter()
        .Name("counter")
        .Help("Test Counter")
        .Register(registry)
        .Add({{"name", "test_counter"}});
  }

  auto collected = registry.Collect();
  EXPECT_EQ(1U, collected.size());
}